

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
::internal_emplace<phmap::priv::(anonymous_namespace)::InsertMultiHintData>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
           *this,iterator iter,InsertMultiHintData *args)

{
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  bVar1;
  ulong uVar2;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *c;
  byte bVar3;
  allocator_type *alloc;
  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
  *pbVar4;
  ulong uVar5;
  uint uVar6;
  iterator iVar7;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_&,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_*>
  local_38;
  
  pbVar4 = iter.node;
  local_38.position = iter.position;
  local_38.node = pbVar4;
  if (((undefined1  [16])iter & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    if (pbVar4[0xb] ==
        (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
         )0x0) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_&,_phmap::priv::(anonymous_namespace)::InsertMultiHintData_*>
      ::operator--(&local_38);
      local_38.position = local_38.position + 1;
    }
    if (((ulong)local_38.node & 7) == 0) {
      bVar1 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
               )0x1e;
      if (local_38.node[0xb] !=
          (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
           )0x0) {
        bVar1 = local_38.node[0xb];
      }
      if (local_38.node[10] == bVar1) {
        if ((byte)bVar1 < 0x1e) {
          if (local_38.node !=
              (this->root_).
              super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_false>
              ._M_head_impl) {
            __assert_fail("iter.node == root()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xc27,
                          "iterator phmap::priv::btree<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::internal_emplace(iterator, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <phmap::priv::(anonymous namespace)::InsertMultiHintData>]"
                         );
          }
          bVar3 = 0x1e;
          if ((byte)((char)bVar1 * '\x02') < 0x1e) {
            bVar3 = (char)bVar1 * '\x02';
          }
          local_38.node =
               new_leaf_root_node((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                                   *)(ulong)bVar3,(int)pbVar4);
          pbVar4 = (this->root_).
                   super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                   .
                   super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                   .
                   super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                   .
                   super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_false>
                   ._M_head_impl;
          btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
          ::swap(local_38.node,pbVar4,alloc);
          delete_leaf_node((btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                            *)(this->root_).
                              super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                              .
                              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
                              .
                              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_false>
                              ._M_head_impl,pbVar4);
          (this->root_).
          super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
          .
          super__Tuple_impl<1UL,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
          .
          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*>
          .
          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>_*,_false>
          ._M_head_impl = local_38.node;
          this->rightmost_ = local_38.node;
        }
        else {
          rebalance_or_split(this,&local_38);
        }
      }
      pbVar4 = local_38.node;
      if (((ulong)local_38.node & 7) == 0) {
        uVar5 = (ulong)local_38.position;
        uVar2 = (ulong)(byte)local_38.node[10];
        if (uVar5 <= uVar2) {
          for (; uVar5 < uVar2; uVar2 = uVar2 - 1) {
            *(undefined8 *)(local_38.node + uVar2 * 8 + 0xc) =
                 *(undefined8 *)(local_38.node + uVar2 * 8 + 4);
          }
          *(InsertMultiHintData *)(local_38.node + uVar5 * 8 + 0xc) = *args;
          bVar1 = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                   )((char)local_38.node[10] + 1);
          local_38.node[10] = bVar1;
          if (local_38.node[0xb] ==
              (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
               )0x0) {
            uVar5 = uVar5 + 1;
            if (uVar5 < (byte)bVar1) {
              uVar2 = (ulong)(byte)bVar1;
              if ((uint)uVar5 < (uint)(byte)bVar1) {
                do {
                  uVar6 = (int)uVar2 - 1;
                  c = btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                      ::child(pbVar4,(ulong)uVar6);
                  btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
                  ::set_child(pbVar4,uVar2,c);
                  uVar2 = (ulong)uVar6;
                } while ((int)(uint)uVar5 < (int)uVar6);
              }
              btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::InsertMultiHintData,_phmap::priv::(anonymous_namespace)::InsertMultiHintDataKeyCompare,_std::allocator<phmap::priv::(anonymous_namespace)::InsertMultiHintData>,_256,_true>_>
              ::mutable_child(pbVar4,uVar5);
            }
          }
          this->size_ = this->size_ + 1;
          iVar7.position = local_38.position;
          iVar7.node = local_38.node;
          iVar7._12_4_ = 0;
          return iVar7;
        }
        __assert_fail("i <= count()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x852,
                      "void phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>, Args = <phmap::priv::(anonymous namespace)::InsertMultiHintData>]"
                     );
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *, unsigned char, phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::btree_node<phmap::priv::set_params<phmap::priv::(anonymous namespace)::InsertMultiHintData, phmap::priv::(anonymous namespace)::InsertMultiHintDataKeyCompare, std::allocator<phmap::priv::(anonymous namespace)::InsertMultiHintData>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline auto btree<P>::internal_emplace(iterator iter, Args &&... args)
        -> iterator {
        if (!iter.node->leaf()) {
            // We can't insert on an internal node. Instead, we'll insert after the
            // previous value which is guaranteed to be on a leaf node.
            --iter;
            ++iter.position;
        }
        const int max_count = iter.node->max_count();
        if (iter.node->count() == max_count) {
            // Make room in the leaf for the new item.
            if (max_count < kNodeValues) {
                // Insertion into the root where the root is smaller than the full node
                // size. Simply grow the size of the root node.
                assert(iter.node == root());
                iter.node =
                    new_leaf_root_node((std::min<int>)(kNodeValues, 2 * max_count));
                iter.node->swap(root(), mutable_allocator());
                delete_leaf_node(root());
                mutable_root() = iter.node;
                rightmost_ = iter.node;
            } else {
                rebalance_or_split(&iter);
            }
        }
        iter.node->emplace_value(iter.position, mutable_allocator(),
                                 std::forward<Args>(args)...);
        ++size_;
        return iter;
    }